

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O1

void Sdm_ManFree(Sdm_Man_t *p)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *pVVar2;
  Hsh_IntMan_t *__ptr;
  
  pVVar1 = p->vPerm6;
  if (pVVar1->pArray != (word *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (word *)0x0;
  }
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    free(pVVar1);
  }
  pVVar2 = p->vMap2Perm;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vConfgRes;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->pHash->vData;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  __ptr = p->pHash;
  pVVar2 = __ptr->vTable;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar1 = __ptr->vObjs;
  if (pVVar1->pArray != (word *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (word *)0x0;
  }
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    free(pVVar1);
  }
  if (__ptr != (Hsh_IntMan_t *)0x0) {
    free(__ptr);
  }
  if (p != (Sdm_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sdm_ManFree( Sdm_Man_t * p )
{
    Vec_WrdFree( p->vPerm6 );
    Vec_IntFree( p->vMap2Perm );
    Vec_IntFree( p->vConfgRes );
    Vec_IntFree( p->pHash->vData );
    Hsh_IntManStop( p->pHash );
    ABC_FREE( p );
}